

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O3

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::tick(ut_metadata_peer_plugin *this)

{
  int *__src;
  int piece;
  int *__dest;
  int *piVar1;
  
  maybe_send_request(this);
  while( true ) {
    __dest = (this->m_incoming_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->m_incoming_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((__dest == piVar1) || (0x27fff < (this->m_pc->super_peer_connection).m_send_buffer.m_bytes))
    break;
    piece = *__dest;
    __src = __dest + 1;
    if (__src != piVar1) {
      memmove(__dest,__src,(long)piVar1 - (long)__src);
      piVar1 = (this->m_incoming_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    (this->m_incoming_requests).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1 + -1;
    write_metadata_packet(this,piece,piece);
  }
  return;
}

Assistant:

void tick() override
		{
			maybe_send_request();
			while (!m_incoming_requests.empty()
				&& m_pc.send_buffer_size() < send_buffer_limit)
			{
				int const piece = m_incoming_requests.front();
				m_incoming_requests.erase(m_incoming_requests.begin());
				write_metadata_packet(msg_t::piece, piece);
			}
		}